

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O3

void nni_id_map_sys_fini(void)

{
  nni_id_map *pnVar1;
  int iVar2;
  long lVar3;
  nni_id_map **ptr;
  
  nni_mtx_lock(&id_reg_mtx);
  ptr = id_reg_map;
  if (0 < id_reg_num) {
    lVar3 = 0;
    iVar2 = id_reg_num;
    do {
      pnVar1 = ptr[lVar3];
      if ((pnVar1 != (nni_id_map *)0x0) && (pnVar1->id_entries != (nni_id_entry *)0x0)) {
        nni_free(pnVar1->id_entries,(ulong)pnVar1->id_cap * 0x18);
        pnVar1->id_entries = (nni_id_entry *)0x0;
        pnVar1->id_cap = 0;
        pnVar1->id_count = 0;
        pnVar1->id_load = 0;
        pnVar1->id_min_load = 0;
        pnVar1->id_max_load = 0;
        ptr = id_reg_map;
        iVar2 = id_reg_num;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar2);
  }
  nni_free(ptr,(long)id_reg_len << 3);
  id_reg_map = (nni_id_map **)0x0;
  id_reg_len = 0;
  id_reg_num = 0;
  nni_mtx_unlock(&id_reg_mtx);
  return;
}

Assistant:

void
nni_id_map_sys_fini(void)
{
	nni_mtx_lock(&id_reg_mtx);
	for (int i = 0; i < id_reg_num; i++) {
		if (id_reg_map[i] != NULL) {
			nni_id_map_fini(id_reg_map[i]);
		}
	}
	nni_free(id_reg_map, sizeof(nni_id_map *) * id_reg_len);
	id_reg_map = NULL;
	id_reg_len = 0;
	id_reg_num = 0;
	nni_mtx_unlock(&id_reg_mtx);
}